

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet6_address.cpp
# Opt level: O2

result<sockpp::inet6_address> *
sockpp::inet6_address::create
          (result<sockpp::inet6_address> *__return_storage_ptr__,string *saddr,in_port_t port)

{
  result<in6_addr> res;
  undefined8 local_78;
  uint32_t local_70;
  anon_union_16_3_a3f0114d_for___in6_u local_68;
  int local_58;
  undefined4 uStack_54;
  error_category *peStack_50;
  inet6_address local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,(saddr->_M_dataplus)._M_p,(allocator<char> *)&local_78);
  resolve_name((result<in6_addr> *)&local_68,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (local_58 == 0) {
    local_48.addr_._4_8_ = (ulong)local_68.__u6_addr32[0] << 0x20;
    local_78 = local_68._4_8_;
    local_70 = local_68.__u6_addr32[3];
    local_48.addr_.sin6_port = port << 8 | port >> 8;
    local_48.super_sock_address._vptr_sock_address = (_func_int **)&PTR__sock_address_0010db38;
    local_48.addr_.sin6_family = 10;
    local_48.addr_.sin6_addr.__in6_u._4_8_ = local_68._4_8_;
    local_48.addr_.sin6_addr.__in6_u.__u6_addr32[3] = local_68.__u6_addr32[3];
    local_48.addr_.sin6_scope_id = 0;
    result<sockpp::inet6_address>::result(__return_storage_ptr__,&local_48);
  }
  else {
    *(undefined8 *)&(__return_storage_ptr__->val_).addr_.sin6_scope_id = 0;
    (__return_storage_ptr__->val_).super_sock_address._vptr_sock_address =
         (_func_int **)&PTR__sock_address_0010db38;
    (__return_storage_ptr__->val_).addr_.sin6_family = 0;
    (__return_storage_ptr__->val_).addr_.sin6_port = 0;
    (__return_storage_ptr__->val_).addr_.sin6_flowinfo = 0;
    *(undefined8 *)&(__return_storage_ptr__->val_).addr_.sin6_addr.__in6_u = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->val_).addr_.sin6_addr.__in6_u + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->val_).addr_.sin6_addr.__in6_u + 0xc) = 0;
    *(ulong *)&__return_storage_ptr__->err_ = CONCAT44(uStack_54,local_58);
    (__return_storage_ptr__->err_)._M_cat = peStack_50;
  }
  return __return_storage_ptr__;
}

Assistant:

result<inet6_address> inet6_address::create(const string& saddr, in_port_t port) {
    auto res = resolve_name(saddr.c_str());
    if (!res)
        return res.error();

    auto addr = sockaddr_in6{};
    addr.sin6_family = AF_INET6;
    addr.sin6_addr = res.value();
    addr.sin6_port = htons(port);
#if defined(__APPLE__) || defined(BSD)
    addr.sin6_len = (uint8_t)SZ;
#endif
    return inet6_address{addr};
}